

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpc-test.c++
# Opt level: O0

void __thiscall
capnp::_::anon_unknown_0::TestNetworkAdapter::ConnectionImpl::IncomingRpcMessageImpl::
~IncomingRpcMessageImpl(IncomingRpcMessageImpl *this)

{
  IncomingRpcMessageImpl *this_local;
  
  ~IncomingRpcMessageImpl(this);
  operator_delete(this,0x138);
  return;
}

Assistant:

IncomingRpcMessageImpl(kj::Array<word> data)
          : data(kj::mv(data)),
            message(this->data) {}